

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall icu_63::Edits::Iterator::previous(Iterator *this,UErrorCode *errorCode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t *puVar5;
  uint uVar6;
  ulong uVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  if (-1 < this->dir) {
    if (this->dir != '\0') {
      if (0 < this->remaining) {
        this->index = this->index + -1;
        this->dir = -1;
        return '\x01';
      }
      this->srcIndex = this->srcIndex + this->oldLength_;
      if (this->changed != '\0') {
        this->replIndex = this->replIndex + this->newLength_;
      }
      this->destIndex = this->destIndex + this->newLength_;
    }
    this->dir = -1;
  }
  uVar10 = this->remaining;
  if ((int)uVar10 < 1) {
    uVar7 = (ulong)(uint)this->index;
  }
  else {
    uVar7 = (ulong)this->index;
    if (uVar10 <= (this->array[uVar7] & 0x1ff)) {
      this->remaining = uVar10 + 1;
      this->srcIndex = this->srcIndex - this->oldLength_;
      if (this->changed != '\0') {
        this->replIndex = this->replIndex - this->newLength_;
      }
      this->destIndex = this->destIndex - this->newLength_;
      return '\x01';
    }
    this->remaining = 0;
  }
  iVar9 = (int)uVar7;
  if (iVar9 < 1) {
    *(undefined2 *)((long)&this->newLength_ + 2) = 0;
    *(undefined8 *)&this->dir = 0;
    return '\0';
  }
  puVar5 = this->array;
  uVar10 = iVar9 - 1;
  uVar11 = (ulong)uVar10;
  this->index = uVar10;
  uVar3 = puVar5[uVar11];
  if (uVar3 < 0x1000) {
    this->changed = '\0';
    iVar8 = uVar3 + 1;
    if (iVar9 != 1) {
      do {
        uVar10 = (int)uVar7 - 1;
        uVar3 = puVar5[(ulong)uVar10 - 1];
        if (0xfff < uVar3) break;
        this->index = (int)uVar7 + -2;
        iVar8 = iVar8 + (uint)uVar3 + 1;
        uVar7 = (ulong)uVar10;
      } while (1 < (int)uVar10);
    }
    this->oldLength_ = iVar8;
    this->newLength_ = iVar8;
    this->srcIndex = this->srcIndex - iVar8;
    goto LAB_00312928;
  }
  this->changed = '\x01';
  if (uVar3 < 0x7000) {
    uVar6 = (uint)(uVar3 >> 0xc);
    uVar10 = uVar3 >> 9 & 7;
    if (this->coarse == '\0') {
      this->oldLength_ = uVar6;
      this->newLength_ = uVar10;
      if ((uVar3 & 0x1ff) != 0) {
        this->remaining = 1;
      }
      this->srcIndex = this->srcIndex - uVar6;
      uVar1 = this->replIndex;
      uVar2 = this->destIndex;
      this->replIndex = uVar1 - uVar10;
      this->destIndex = uVar2 - uVar10;
      return '\x01';
    }
    iVar9 = (uVar3 & 0x1ff) + 1;
    this->oldLength_ = uVar6 * iVar9;
    iVar8 = iVar9 * uVar10;
    this->newLength_ = iVar8;
LAB_0031287f:
    if (0 < (int)uVar11) {
      do {
        uVar3 = this->array[uVar11 - 1];
        if (uVar3 < 0x1000) break;
        uVar10 = (uint)uVar11;
        uVar6 = uVar10 - 1;
        uVar11 = (ulong)uVar6;
        this->index = uVar6;
        if (uVar3 < 0x7000) {
          iVar9 = (uVar3 & 0x1ff) + 1;
          this->oldLength_ = this->oldLength_ + (uint)(uVar3 >> 0xc) * iVar9;
          iVar8 = iVar8 + (uVar3 >> 9 & 7) * iVar9;
          this->newLength_ = iVar8;
        }
        else if (-1 < (short)uVar3) {
          this->index = uVar10;
          iVar8 = readLength(this,uVar3 >> 6 & 0x3f);
          this->oldLength_ = this->oldLength_ + iVar8;
          iVar8 = readLength(this,uVar3 & 0x3f);
          iVar8 = iVar8 + this->newLength_;
          this->newLength_ = iVar8;
          this->index = uVar6;
        }
      } while (1 < uVar10);
    }
  }
  else {
    if ((short)uVar3 < 0) {
      puVar5 = puVar5 + uVar10;
      do {
        puVar5 = puVar5 + -1;
        uVar4 = *puVar5;
        iVar9 = (int)uVar7;
        uVar10 = iVar9 - 1;
        uVar7 = (ulong)uVar10;
      } while ((short)uVar4 < 0);
      this->index = uVar10;
      iVar8 = readLength(this,(uint)(int)(short)uVar4 >> 6 & 0x3f);
      this->oldLength_ = iVar8;
      iVar8 = readLength(this,(int)(short)uVar4 & 0x3f);
      this->newLength_ = iVar8;
      this->index = iVar9 + -2;
    }
    else {
      iVar8 = readLength(this,uVar3 >> 6 & 0x3f);
      this->oldLength_ = iVar8;
      iVar8 = readLength(this,uVar3 & 0x3f);
      this->newLength_ = iVar8;
    }
    if (this->coarse != '\0') {
      uVar11 = (ulong)(uint)this->index;
      goto LAB_0031287f;
    }
  }
  this->srcIndex = this->srcIndex - this->oldLength_;
  if (this->changed != '\0') {
    this->replIndex = this->replIndex - iVar8;
  }
LAB_00312928:
  this->destIndex = this->destIndex - iVar8;
  return '\x01';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }